

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O1

void nite::graphicsInit(void)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  GLenum GVar11;
  char *pcVar12;
  Indexer *this;
  longlong lVar13;
  long *plVar14;
  undefined8 *puVar15;
  uint uVar16;
  ulong *puVar17;
  long *plVar18;
  size_type *psVar19;
  undefined8 uVar20;
  EVP_PKEY_CTX *ctx;
  undefined1 ctx_00 [8];
  ulong uVar21;
  long lVar22;
  undefined1 local_118 [4];
  int local_114;
  SDL_DisplayMode DM;
  long local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  Node local_e0;
  long local_d8;
  undefined1 local_d0 [32];
  undefined8 local_b0;
  Node node;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [8];
  string err;
  size_type __dnew;
  ulong local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  initDelta = getTicks();
  printInit();
  ctx_00 = (undefined1  [8])0xf231;
  iVar7 = SDL_Init();
  if (iVar7 < 0) {
    pcVar12 = (char *)SDL_GetError();
    std::__cxx11::string::string((string *)local_90,pcVar12,(allocator *)&local_50);
    std::operator+(&local_50,"fatal error: SDL was unable to start: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    print(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    AsyncTask::update();
    AsyncTask::end();
    running = 0;
    printEnd();
    ctx_00 = local_90;
    if (local_90 != (undefined1  [8])&err._M_string_length) {
      operator_delete((void *)local_90);
      ctx_00 = local_90;
    }
  }
  AsyncTask::init((EVP_PKEY_CTX *)ctx_00);
  socketInit();
  FileTransfer::init((EVP_PKEY_CTX *)ctx_00);
  inderxerInit();
  this = getIndexer();
  psVar1 = &err._M_string_length;
  local_90 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"./data/map/","");
  Indexer::indexDir(this,(string *)local_90);
  if (local_90 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_90);
  }
  local_90 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"./data/tileset/","");
  Indexer::indexDir(this,(string *)local_90);
  if (local_90 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_90);
  }
  local_90 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"./data/texture/tileset/","");
  Indexer::indexDir(this,(string *)local_90);
  if (local_90 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_90);
  }
  local_90 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"./data/texture/overworld/","")
  ;
  Indexer::indexDir(this,(string *)local_90);
  if (local_90 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_90);
  }
  local_90 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"./data/texture/weaps/","");
  Indexer::indexDir(this,(string *)local_90);
  if (local_90 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_90);
  }
  local_90 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"./data/texture/ammo/","");
  Indexer::indexDir(this,(string *)local_90);
  if (local_90 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_90);
  }
  signal(2,ctrlC);
  SDL_GetCurrentDisplayMode(0,local_118);
  print("reading data/config.json file");
  Jzon::Parser::Parser((Parser *)local_90);
  paVar2 = &local_50.field_2;
  err.field_2._8_8_ = 0x10;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  local_50._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)((long)&err.field_2 + 8));
  local_50.field_2._M_allocated_capacity._0_4_ = (undefined4)err.field_2._8_8_;
  local_50.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)err.field_2._8_8_ >> 0x20);
  local_50.field_2._M_allocated_capacity._6_2_ = (undefined2)((ulong)err.field_2._8_8_ >> 0x30);
  builtin_strncpy(local_50._M_dataplus._M_p,"data/config.json",0x10);
  local_50._M_string_length = err.field_2._8_8_;
  local_50._M_dataplus._M_p[err.field_2._8_8_] = '\0';
  Jzon::Parser::parseFile((Parser *)&stack0xffffffffffffff50,(string *)local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50.field_2._M_allocated_capacity._0_4_ = 0x74646977;
  local_50.field_2._M_allocated_capacity._4_2_ = 0x68;
  local_50._M_string_length = 5;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  Jzon::Node::get(&local_e0,(string *)&stack0xffffffffffffff50);
  iVar7 = Jzon::Node::toInt(&local_e0,0x500);
  local_60 = CONCAT17(local_60._7_1_,0x746867696568);
  err.field_2._8_8_ = &local_60;
  Jzon::Node::get((Node *)(local_d0 + 0x18),(string *)&stack0xffffffffffffff50);
  iVar8 = Jzon::Node::toInt((Node *)(local_d0 + 0x18),0x2d0);
  Vec2::Vec2((Vec2 *)&DM.driverdata,(float)iVar7,(float)iVar8);
  ::size = (Vec2)DM.driverdata;
  Jzon::Node::~Node((Node *)(local_d0 + 0x18));
  if ((ulong *)err.field_2._8_8_ != &local_60) {
    operator_delete((void *)err.field_2._8_8_);
  }
  Jzon::Node::~Node(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50.field_2._M_allocated_capacity._0_4_ = 0x707062;
  local_50._M_string_length = 3;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  Jzon::Node::get((Node *)((long)&err.field_2 + 8),(string *)&stack0xffffffffffffff50);
  bitsPerPixel = Jzon::Node::toInt((Node *)((long)&err.field_2 + 8),0x20);
  Jzon::Node::~Node((Node *)((long)&err.field_2 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50.field_2._M_allocated_capacity._0_4_ = 0x6f747561;
  local_50.field_2._M_allocated_capacity._4_2_ = 0x6572;
  local_50.field_2._M_allocated_capacity._6_2_ = 0x6f73;
  local_50.field_2._8_2_ = 0x756c;
  local_50.field_2._M_local_buf[10] = 't';
  local_50.field_2._M_local_buf[0xb] = 'i';
  local_50.field_2._M_local_buf[0xc] = 'o';
  local_50.field_2._M_local_buf[0xd] = 'n';
  local_50._M_string_length = 0xe;
  local_50.field_2._M_local_buf[0xe] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar2;
  Jzon::Node::get((Node *)((long)&err.field_2 + 8),(string *)&stack0xffffffffffffff50);
  autoResolution = Jzon::Node::toBool((Node *)((long)&err.field_2 + 8),false);
  Jzon::Node::~Node((Node *)((long)&err.field_2 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50.field_2._M_allocated_capacity._0_4_ = 0x6c6c7566;
  local_50.field_2._M_allocated_capacity._4_2_ = 0x6373;
  local_50.field_2._M_allocated_capacity._6_2_ = 0x6572;
  local_50.field_2._8_2_ = 0x6e65;
  local_50._M_string_length = 10;
  local_50.field_2._M_local_buf[10] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar2;
  Jzon::Node::get((Node *)((long)&err.field_2 + 8),(string *)&stack0xffffffffffffff50);
  enableFullscreen = Jzon::Node::toBool((Node *)((long)&err.field_2 + 8),false);
  Jzon::Node::~Node((Node *)((long)&err.field_2 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50.field_2._M_allocated_capacity._0_4_ = 0x6e797376;
  local_50.field_2._M_allocated_capacity._4_2_ = 99;
  local_50._M_string_length = 5;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  Jzon::Node::get((Node *)((long)&err.field_2 + 8),(string *)&stack0xffffffffffffff50);
  enableVSync = Jzon::Node::toBool((Node *)((long)&err.field_2 + 8),true);
  Jzon::Node::~Node((Node *)((long)&err.field_2 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50.field_2._M_allocated_capacity._0_4_ = 0x64726f62;
  local_50.field_2._M_allocated_capacity._4_2_ = 0x7265;
  local_50.field_2._M_allocated_capacity._6_2_ = 0x656c;
  local_50.field_2._8_2_ = 0x7373;
  local_50._M_string_length = 10;
  local_50.field_2._M_local_buf[10] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar2;
  Jzon::Node::get((Node *)((long)&err.field_2 + 8),(string *)&stack0xffffffffffffff50);
  enableBorderless = Jzon::Node::toBool((Node *)((long)&err.field_2 + 8),false);
  Jzon::Node::~Node((Node *)((long)&err.field_2 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50.field_2._M_allocated_capacity._0_4_ = 0x69736572;
  local_50.field_2._M_allocated_capacity._4_2_ = 0x657a;
  local_50.field_2._M_allocated_capacity._6_2_ = 0x6261;
  local_50.field_2._8_2_ = 0x656c;
  local_50._M_string_length = 10;
  local_50.field_2._M_local_buf[10] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar2;
  Jzon::Node::get((Node *)((long)&err.field_2 + 8),(string *)&stack0xffffffffffffff50);
  enableResizable = Jzon::Node::toBool((Node *)((long)&err.field_2 + 8),false);
  Jzon::Node::~Node((Node *)((long)&err.field_2 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50.field_2._M_allocated_capacity._0_4_ = 0x67726174;
  local_50.field_2._M_allocated_capacity._4_2_ = 0x7465;
  local_50.field_2._M_allocated_capacity._6_2_ = 0x7865;
  local_50.field_2._8_2_ = 0x6563;
  local_50.field_2._M_local_buf[10] = 's';
  local_50.field_2._M_local_buf[0xb] = 's';
  local_50._M_string_length = 0xc;
  local_50.field_2._M_local_buf[0xc] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar2;
  Jzon::Node::get((Node *)((long)&err.field_2 + 8),(string *)&stack0xffffffffffffff50);
  local_d0._20_4_ = DM.format;
  local_d0._16_4_ = local_114;
  targetExcess = Jzon::Node::toFloat((Node *)((long)&err.field_2 + 8),1.0);
  Jzon::Node::~Node((Node *)((long)&err.field_2 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  Jzon::Node::~Node((Node *)&stack0xffffffffffffff50);
  Jzon::Parser::~Parser((Parser *)local_90);
  if (parameters_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      parameters_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar22 = 0;
    uVar21 = 0;
    do {
      iVar7 = std::__cxx11::string::compare
                        ((char *)((long)&((parameters_abi_cxx11_.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar22));
      if ((iVar7 == 0) ||
         (iVar7 = std::__cxx11::string::compare
                            ((char *)((long)&((parameters_abi_cxx11_.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar22)), iVar7 == 0)) {
LAB_0017cf1f:
        enableFullscreen = true;
      }
      else {
        iVar7 = std::__cxx11::string::compare
                          ((char *)((long)&((parameters_abi_cxx11_.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + lVar22));
        if ((iVar7 == 0) ||
           (iVar7 = std::__cxx11::string::compare
                              ((char *)((long)&((parameters_abi_cxx11_.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar22)), iVar7 == 0)) {
          autoResolution = true;
        }
        else {
          iVar7 = std::__cxx11::string::compare
                            ((char *)((long)&((parameters_abi_cxx11_.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar22));
          if ((iVar7 == 0) ||
             (iVar7 = std::__cxx11::string::compare
                                ((char *)((long)&((parameters_abi_cxx11_.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar22)), iVar7 == 0))
          goto LAB_0017cf1f;
          iVar7 = std::__cxx11::string::compare
                            ((char *)((long)&((parameters_abi_cxx11_.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar22));
          if ((iVar7 == 0) ||
             (iVar7 = std::__cxx11::string::compare
                                ((char *)((long)&((parameters_abi_cxx11_.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar22)), iVar7 == 0)) {
            enableResizable = true;
          }
          else {
            iVar7 = std::__cxx11::string::compare
                              ((char *)((long)&((parameters_abi_cxx11_.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar22));
            if ((iVar7 == 0) ||
               (iVar7 = std::__cxx11::string::compare
                                  ((char *)((long)&((parameters_abi_cxx11_.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar22)), iVar7 == 0)) {
              enableBorderless = true;
            }
            else {
              iVar7 = std::__cxx11::string::compare
                                ((char *)((long)&((parameters_abi_cxx11_.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar22));
              if (((iVar7 == 0) ||
                  (iVar7 = std::__cxx11::string::compare
                                     ((char *)((long)&((parameters_abi_cxx11_.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar22)), iVar7 == 0)) &&
                 (uVar21 < ((long)parameters_abi_cxx11_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)parameters_abi_cxx11_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                lVar13 = toInt((string *)
                               ((long)&parameters_abi_cxx11_.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p
                               + lVar22));
                ::size.x = (float)lVar13;
              }
              else {
                iVar7 = std::__cxx11::string::compare
                                  ((char *)((long)&((parameters_abi_cxx11_.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar22));
                if (((iVar7 == 0) ||
                    (iVar7 = std::__cxx11::string::compare
                                       ((char *)((long)&((parameters_abi_cxx11_.
                                                                                                                    
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar22)), iVar7 == 0)) &&
                   (uVar21 < ((long)parameters_abi_cxx11_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)parameters_abi_cxx11_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                  lVar13 = toInt((string *)
                                 ((long)&parameters_abi_cxx11_.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus.
                                         _M_p + lVar22));
                  ::size.y = (float)lVar13;
                }
                else {
                  iVar7 = std::__cxx11::string::compare
                                    ((char *)((long)&((parameters_abi_cxx11_.
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar22));
                  if ((iVar7 == 0) ||
                     (iVar7 = std::__cxx11::string::compare
                                        ((char *)((long)&((parameters_abi_cxx11_.
                                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar22)), iVar7 == 0)) {
                    enableVSync = true;
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare
                                      ((char *)((long)&((parameters_abi_cxx11_.
                                                                                                                  
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar22));
                    if ((iVar7 == 0) ||
                       (iVar7 = std::__cxx11::string::compare
                                          ((char *)((long)&((parameters_abi_cxx11_.
                                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar22)), iVar7 == 0)) {
                      enableVSync = false;
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar21 = uVar21 + 1;
      lVar22 = lVar22 + 0x20;
    } while (uVar21 < (ulong)((long)parameters_abi_cxx11_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)parameters_abi_cxx11_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  uVar9 = (uint)enableFullscreen;
  uVar16 = (uint)enableBorderless;
  uVar10 = (uint)enableResizable;
  if (autoResolution != false) {
    Vec2::set(&::size,(float)(int)local_d0._16_4_,(float)(int)local_d0._20_4_);
  }
  SDL_GL_SetAttribute(0xd,1);
  SDL_GL_SetAttribute(0xe,0x10);
  glEnable(0x809d);
  Window = (SDL_Window *)
           SDL_CreateWindow("R E D   B I A S",0x2fff0000,0x2fff0000,(int)::size.x,(int)::size.y,
                            uVar10 * 0x20 + (uVar16 << 4 | uVar9) + 2);
  psVar1 = &err._M_string_length;
  if (Window == (SDL_Window *)0x0) {
    Vec2::str_abi_cxx11_((string *)&stack0xffffffffffffff50,&::size);
    plVar14 = (long *)std::__cxx11::string::replace
                                ((ulong)&stack0xffffffffffffff50,0,(char *)0x0,0x2476de);
    puVar17 = (ulong *)(plVar14 + 2);
    paVar2 = &local_50.field_2;
    if ((ulong *)*plVar14 == puVar17) {
      local_60 = *puVar17;
      lStack_58 = plVar14[3];
      err.field_2._8_8_ = &local_60;
    }
    else {
      local_60 = *puVar17;
      err.field_2._8_8_ = (ulong *)*plVar14;
    }
    *plVar14 = (long)puVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append(err.field_2._M_local_buf + 8);
    plVar18 = plVar14 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar18) {
      local_50.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar18;
      uVar4 = (undefined4)plVar14[3];
      uVar5 = *(undefined4 *)((long)plVar14 + 0x1c);
      local_50.field_2._M_allocated_capacity._4_2_ =
           (undefined2)*(undefined4 *)((long)plVar14 + 0x14);
      local_50.field_2._M_allocated_capacity._6_2_ =
           (undefined2)((uint)*(undefined4 *)((long)plVar14 + 0x14) >> 0x10);
      local_50.field_2._8_2_ = (undefined2)uVar4;
      local_50.field_2._M_local_buf[10] = (char)((uint)uVar4 >> 0x10);
      local_50.field_2._M_local_buf[0xb] = (char)((uint)uVar4 >> 0x18);
      local_50.field_2._M_local_buf[0xc] = (char)uVar5;
      local_50.field_2._M_local_buf[0xd] = (char)((uint)uVar5 >> 8);
      local_50.field_2._M_local_buf[0xe] = (char)((uint)uVar5 >> 0x10);
      local_50.field_2._M_local_buf[0xf] = (char)((uint)uVar5 >> 0x18);
      local_50._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      lVar22 = *plVar18;
      local_50.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar22;
      local_50.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)lVar22 >> 0x20);
      local_50.field_2._M_allocated_capacity._6_2_ = (undefined2)((ulong)lVar22 >> 0x30);
      local_50._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_50._M_string_length = plVar14[1];
    *plVar14 = (long)plVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    pcVar12 = (char *)SDL_GetError();
    std::__cxx11::string::string((string *)&DM.driverdata,pcVar12,(allocator *)&local_e0);
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      uVar21 = CONCAT26(local_50.field_2._M_allocated_capacity._6_2_,
                        CONCAT24(local_50.field_2._M_allocated_capacity._4_2_,
                                 local_50.field_2._M_allocated_capacity._0_4_));
    }
    if (uVar21 < local_f8 + local_50._M_string_length) {
      uVar20 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)DM.driverdata != &local_f0) {
        uVar20 = local_f0._M_allocated_capacity;
      }
      if ((ulong)uVar20 < local_f8 + local_50._M_string_length) goto LAB_0017d231;
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&DM.driverdata,0,(char *)0x0,(ulong)local_50._M_dataplus._M_p);
    }
    else {
LAB_0017d231:
      puVar15 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_50,(ulong)DM.driverdata);
    }
    psVar19 = puVar15 + 2;
    if ((size_type *)*puVar15 == psVar19) {
      err._M_string_length = *psVar19;
      err.field_2._M_allocated_capacity = puVar15[3];
      local_90 = (undefined1  [8])psVar1;
    }
    else {
      err._M_string_length = *psVar19;
      local_90 = (undefined1  [8])*puVar15;
    }
    err._M_dataplus._M_p = (pointer)puVar15[1];
    *puVar15 = psVar19;
    puVar15[1] = 0;
    *(undefined1 *)psVar19 = 0;
    print((string *)local_90);
    if (local_90 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)DM.driverdata != &local_f0) {
      operator_delete(DM.driverdata);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((ulong *)err.field_2._8_8_ != &local_60) {
      operator_delete((void *)err.field_2._8_8_);
    }
    if ((undefined8 *)local_b0 != &stack0xffffffffffffff60) {
      operator_delete((void *)local_b0);
    }
    exit((int)local_b0);
  }
  Context = (SDL_GLContext)SDL_GL_CreateContext(Window);
  SDL_GL_MakeCurrent(Window,Context);
  GVar11 = glewInit();
  if (GVar11 != 0) {
    iVar7 = 0x2476fe;
    print("GLEW failed to initialize.");
    exit(iVar7);
  }
  graphicsInitd = 1;
  running = 1;
  glClearColor(0,0,0,0x3f800000);
  glClear(0x4000);
  glDisable(0xb71);
  glEnable(0xde1);
  glEnable(0xbe2);
  glBlendFunc(0x302,0x303);
  lVar22 = 0;
  glViewport(0,0,(int)::size.x,(int)::size.y);
  glMatrixMode(0x1701);
  glLoadIdentity();
  glOrtho(0,(double)::size.x,(double)::size.y,0,0x3ff0000000000000,0xbff0000000000000);
  glMatrixMode(0x1700);
  glLoadIdentity();
  glTexParameteri(0xde1,0x2801,0x2601);
  ctx = (EVP_PKEY_CTX *)0x2800;
  glTexParameteri(0xde1,0x2800,0x2601);
  SDL_GL_SetSwapInterval(enableVSync);
  SDL_GL_SetSwapInterval(enableVSync);
  do {
    RenderTarget::init((RenderTarget *)
                       ((long)&targets[0].objects.
                               super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar22),ctx);
    lVar22 = lVar22 + 0x50;
  } while (lVar22 != 0x3c0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 "nite engine | OS ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 niteCurrentPlatform_abi_cxx11_);
  print((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
  if (local_90 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_90);
  }
  Vec2::str_abi_cxx11_((string *)&DM.driverdata,&::size);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&DM.driverdata,0,(char *)0x0,0x24772b);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_a0 = *psVar19;
    uStack_98 = plVar14[3];
    local_b0 = &stack0xffffffffffffff60;
  }
  else {
    local_a0 = *psVar19;
    local_b0 = (size_type *)*plVar14;
  }
  node.data = (Data *)plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&stack0xffffffffffffff50);
  puVar17 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar17) {
    local_60 = *puVar17;
    lStack_58 = plVar14[3];
    err.field_2._8_8_ = &local_60;
  }
  else {
    local_60 = *puVar17;
    err.field_2._8_8_ = (ulong *)*plVar14;
  }
  lVar22 = plVar14[1];
  *plVar14 = (long)puVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  local_e0.data = (Data *)local_d0;
  if (enableFullscreen == true) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"fullscreen","");
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"windowed","");
  }
  uVar21 = 0xf;
  if ((ulong *)err.field_2._8_8_ != &local_60) {
    uVar21 = local_60;
  }
  if (uVar21 < (ulong)(local_d8 + lVar22)) {
    uVar21 = 0xf;
    if (local_e0.data != (Data *)local_d0) {
      uVar21 = local_d0._0_8_;
    }
    if ((ulong)(local_d8 + lVar22) <= uVar21) {
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,err.field_2._8_8_);
      goto LAB_0017d616;
    }
  }
  puVar15 = (undefined8 *)
            std::__cxx11::string::_M_append(err.field_2._M_local_buf + 8,(ulong)local_e0.data);
LAB_0017d616:
  puVar3 = puVar15 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3) {
    uVar20 = *puVar3;
    uVar6 = puVar15[3];
    local_50.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar20;
    local_50.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)uVar20 >> 0x20);
    local_50.field_2._M_allocated_capacity._6_2_ = (undefined2)((ulong)uVar20 >> 0x30);
    local_50.field_2._8_2_ = (undefined2)uVar6;
    local_50.field_2._M_local_buf[10] = (char)((ulong)uVar6 >> 0x10);
    local_50.field_2._M_local_buf[0xb] = (char)((ulong)uVar6 >> 0x18);
    local_50.field_2._M_local_buf[0xc] = (char)((ulong)uVar6 >> 0x20);
    local_50.field_2._M_local_buf[0xd] = (char)((ulong)uVar6 >> 0x28);
    local_50.field_2._M_local_buf[0xe] = (char)((ulong)uVar6 >> 0x30);
    local_50.field_2._M_local_buf[0xf] = (char)((ulong)uVar6 >> 0x38);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    uVar20 = *puVar3;
    local_50.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar20;
    local_50.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)uVar20 >> 0x20);
    local_50.field_2._M_allocated_capacity._6_2_ = (undefined2)((ulong)uVar20 >> 0x30);
    local_50._M_dataplus._M_p = (pointer)*puVar15;
  }
  local_50._M_string_length = puVar15[1];
  *puVar15 = puVar3;
  puVar15[1] = 0;
  *(undefined1 *)puVar3 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_50);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    err._M_string_length = *psVar19;
    err.field_2._M_allocated_capacity = plVar14[3];
    local_90 = (undefined1  [8])psVar1;
  }
  else {
    err._M_string_length = *psVar19;
    local_90 = (undefined1  [8])*plVar14;
  }
  err._M_dataplus._M_p = (pointer)plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  print((string *)local_90);
  if (local_90 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_e0.data != (Data *)local_d0) {
    operator_delete(local_e0.data);
  }
  if ((ulong *)err.field_2._8_8_ != &local_60) {
    operator_delete((void *)err.field_2._8_8_);
  }
  if ((undefined8 *)local_b0 != &stack0xffffffffffffff60) {
    operator_delete((void *)local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)DM.driverdata != &local_f0) {
    operator_delete(DM.driverdata);
  }
  return;
}

Assistant:

void nite::graphicsInit(){
	nite::updateDelta();
	nite::printInit();
	if (SDL_Init(SDL_INIT_EVERYTHING) < 0){
		String err = SDL_GetError();
		nite::print("fatal error: SDL was unable to start: "+err);
		 gameExit();
	}
	nite::AsyncTask::init();
	nite::socketInit();
	nite::FileTransfer::init();
	nite::inderxerInit();
    auto indexer = nite::getIndexer();
    indexer->indexDir("./data/map/");
    indexer->indexDir("./data/tileset/");
    indexer->indexDir("./data/texture/tileset/");
	indexer->indexDir("./data/texture/overworld/");
	indexer->indexDir("./data/texture/weaps/");
	indexer->indexDir("./data/texture/ammo/");
	signal(SIGINT, ctrlC);

	int Flags = SDL_WINDOW_OPENGL;

	SDL_DisplayMode DM;
	SDL_GetCurrentDisplayMode(0, &DM);
	auto displayWidth = DM.w;
	auto displayHeight = DM.h;

	readConfigFile();

	for(int i = 0; i < parameters.size(); ++i){
		if(parameters[i] == "-wd" || parameters[i] == "--windowed"){
			enableFullscreen = true;
		}else		
		if(parameters[i] == "-ars" || parameters[i] == "--auto-resolution"){
			autoResolution = true;
		}else
		if(parameters[i] == "-fs" || parameters[i] == "--fullscreen"){
			enableFullscreen = true;
		}else
		if(parameters[i] == "-rs" || parameters[i] == "--resizeable"){
			enableResizable = true;
		}else
		if(parameters[i] == "-bdl" || parameters[i] == "--borderless"){
			enableBorderless = true;
		}else
		if((parameters[i] == "-w" || parameters[i] == "--width") && i < parameters.size()-1){
			size.x = nite::toInt(parameters[i+1]);
		}else
		if((parameters[i] == "-h" || parameters[i] == "--height") && i < parameters.size()-1){
			size.y = nite::toInt(parameters[i+1]);
		}else
		if((parameters[i] == "-vsync" || parameters[i] == "--vertical-synchronization")){
			enableVSync = true;
		}else
		if((parameters[i] == "-nvsync" || parameters[i] == "--no-vertical-synchronization")){
			enableVSync = false;
		}											
	}

	if(enableFullscreen){
		Flags |= SDL_WINDOW_FULLSCREEN;
	}
	if(enableBorderless){
		Flags |= SDL_WINDOW_BORDERLESS;
	}
	if(enableResizable){
		Flags |= SDL_WINDOW_RESIZABLE;
	}
	if(autoResolution){
		size.set(displayWidth, displayHeight);
	}

	const char *n = "R E D   B I A S";

   SDL_GL_SetAttribute(SDL_GL_MULTISAMPLEBUFFERS, 1);
   SDL_GL_SetAttribute(SDL_GL_MULTISAMPLESAMPLES, 16);
   glEnable(GL_MULTISAMPLE);

	Window = SDL_CreateWindow(n, SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED, size.x, size.y, Flags);
	
	if(Window == NULL){
		nite::print("failed to create window | size "+size.str()+": "+String(SDL_GetError()));
		nite::exit();
	}
	
	Context = SDL_GL_CreateContext(Window);
	SDL_GL_MakeCurrent(Window, Context);

	if (glewInit() != GLEW_OK){
		nite::print("GLEW failed to initialize.");
		nite::exit();
	}

	graphicsInitd = true;
	running = true;

	setupOpenGL();
	SDL_GL_SetSwapInterval(enableVSync ? 1 : 0);
	for(int c = 0; c < RenderTargetNumber; ++c){
		targets[c].init();
	}

	nite::print("nite engine | OS "+niteCurrentPlatform);
	nite::print("graphics init "+size.str()+" ("+(enableFullscreen ? String("fullscreen") : String("windowed"))+")");
	// debugFont.load("data/font/VeraMono.ttf", 18 * nite::getGeneralScale());
}